

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O0

type_conflict __thiscall
jsoncons::basic_staj_event<char>::get_<int,std::allocator<char>>
          (void *param_1,undefined8 param_2,char *param_3)

{
  bool bVar1;
  to_integer_errc tVar2;
  type tVar3;
  type result;
  int val;
  undefined8 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  char *local_38;
  undefined1 in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd1;
  undefined4 in_stack_ffffffffffffffd8;
  uint in_stack_ffffffffffffffdc;
  uint local_4;
  
  switch(*param_1) {
  case 1:
    tVar3 = detail::to_integer<int,char>
                      (param_3,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                       (int *)CONCAT71(in_stack_ffffffffffffffd1,in_stack_ffffffffffffffd0));
    local_38 = tVar3.ptr;
    tVar2 = tVar3.ec;
    bVar1 = detail::to_integer_result::operator_cast_to_bool((to_integer_result *)&local_38);
    local_4 = in_stack_ffffffffffffffdc;
    if (!bVar1) {
      std::error_code::operator=
                ((error_code *)CONCAT71(in_stack_ffffffffffffffc1,tVar2),tVar3.ptr._4_4_);
      local_4 = 0;
    }
    break;
  default:
    std::error_code::operator=
              ((error_code *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),
               (conv_errc)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    local_4 = 0;
    break;
  case 4:
    local_4 = (uint)((*(byte *)((long)param_1 + 0x10) & 1) != 0);
    break;
  case 5:
    local_4 = (uint)*(undefined8 *)((long)param_1 + 0x10);
    break;
  case 6:
    local_4 = (uint)*(undefined8 *)((long)param_1 + 0x10);
    break;
  case 8:
    local_4 = (uint)*(ushort *)((long)param_1 + 0x10);
    break;
  case 9:
    local_4 = (uint)*(double *)((long)param_1 + 0x10);
  }
  return local_4;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<IntegerType>::value, IntegerType>::type
    get_(Allocator, std::error_code& ec) const
    {
        switch (event_type_)
        {
            case staj_event_type::string_value:
            {
                IntegerType val;
                auto result = jsoncons::detail::to_integer(value_.string_data_, length_, val);
                if (!result)
                {
                    ec = conv_errc::not_integer;
                    return IntegerType();
                }
                return val;
            }
            case staj_event_type::half_value:
                return static_cast<IntegerType>(value_.half_value_);
            case staj_event_type::double_value:
                return static_cast<IntegerType>(value_.double_value_);
            case staj_event_type::int64_value:
                return static_cast<IntegerType>(value_.int64_value_);
            case staj_event_type::uint64_value:
                return static_cast<IntegerType>(value_.uint64_value_);
            case staj_event_type::bool_value:
                return static_cast<IntegerType>(value_.bool_value_ ? 1 : 0);
            default:
                ec = conv_errc::not_integer;
                return IntegerType();
        }
    }